

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.hpp
# Opt level: O2

void __thiscall qclab::qgates::SWAP<double>::SWAP(SWAP<double> *this,int qubit0,int qubit1)

{
  int iVar1;
  int qubits [2];
  int local_8;
  int local_4;
  
  (this->super_QGate2<double>).super_QObject<double>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_004d1870;
  iVar1 = qubit0;
  if (qubit1 < qubit0) {
    iVar1 = qubit1;
  }
  (this->qubits_)._M_elems[0] = iVar1;
  iVar1 = qubit1;
  if (qubit1 < qubit0) {
    iVar1 = qubit0;
  }
  (this->qubits_)._M_elems[1] = iVar1;
  _local_8 = CONCAT44(qubit1,qubit0);
  setQubits(this,&local_8);
  return;
}

Assistant:

SWAP( const int qubit0 , const int qubit1 )
        : qubits_( { std::min( qubit0 , qubit1 ) ,
                     std::max( qubit0 , qubit1 ) } )
        {
          const int qubits[] = { qubit0 , qubit1 } ;
          setQubits( &qubits[0] ) ;
        }